

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O1

bool isPrimeMillerRabin(BN *n,size_t k)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  size_t shift;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  BN x;
  BN n1;
  BN a;
  BN t;
  BN local_c8;
  BN local_b0;
  size_t local_98;
  BN local_90;
  BN local_78;
  BN local_60;
  BN local_48;
  
  bVar1 = BN::isEven(n);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    BN::BN(&local_90,n);
    BN::operator--(&local_90);
    shift = BN::countzeroright(&local_90);
    BN::operator>>(&local_48,&local_90,shift);
    bVar1 = k == 0;
    if (!bVar1) {
      uVar8 = 0;
      local_98 = k;
      do {
        BN::BN(&local_60,uVar8 + 2);
        BN::PowMod(&local_b0,&local_60,&local_48,n);
        BN::bn1();
        bVar2 = BN::operator==(&local_b0,&local_c8);
        if (bVar2) {
          if (local_c8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          bVar6 = 0;
        }
        else {
          bVar2 = BN::operator==(&local_b0,&local_90);
          if (local_c8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          bVar6 = 0;
          if (!bVar2) {
            bVar2 = shift == 1;
            if (shift == 1) {
              bVar4 = 5;
              bVar6 = 1;
            }
            else {
              uVar7 = 1;
              bVar5 = false;
              do {
                BN::Qrt(&local_78,&local_b0);
                BN::operator%(&local_c8,&local_78,n);
                BN::operator=(&local_b0,&local_c8);
                if (local_c8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_c8.ba.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.ba.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                BN::bn1();
                bVar3 = BN::operator==(&local_b0,&local_c8);
                if (local_c8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_c8.ba.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if (bVar3) {
                  bVar4 = 1;
                  goto LAB_0010743e;
                }
                bVar2 = BN::operator==(&local_b0,&local_90);
                if (bVar2) {
                  bVar5 = true;
                }
                bVar3 = shift - 1 <= uVar7;
                bVar2 = (bool)(bVar3 | bVar5);
                uVar7 = uVar7 + 1;
              } while (!bVar3 && !bVar5);
              bVar4 = 5;
LAB_0010743e:
              bVar6 = ~bVar5;
              k = local_98;
            }
            if (bVar2 == false) {
              bVar6 = bVar4;
            }
          }
        }
        if (local_b0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if ((bVar6 & 3) != 0) break;
        uVar8 = uVar8 + 1;
        bVar1 = k <= uVar8;
      } while (uVar8 != k);
    }
    if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar1;
}

Assistant:

bool isPrimeMillerRabin(const BN& n, size_t k) {
    if (n.isEven()) {
        return false;
    }
    BN n1(n);
    --n1;
    size_t s = n1.countzeroright();
    BN t = n1 >> s;
    for (size_t i = 0; i < k; ++i) {
        BN a(uint64_t(i + 2));
        BN x = a.PowMod(t, n);
        if (x == BN::bn1() || x == n1)
            continue;
        bool stop = false;
        for (size_t j = 0; !stop && j < s - 1; ++j) {
            x = x.Qrt() % n;
            if (x == BN::bn1())
                return false;
            if (x == n1)
                stop = true;
        }
        if (!stop)
            return false;
    }
    return true;
}